

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void TrackMemberNodesInObjectForIntConstants
               (ByteCodeGenerator *byteCodeGenerator,ParseNodePtr objNode)

{
  ParseNode *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeUni *pPVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStr *pPVar6;
  ParseNodePtr this_00;
  ParseNodePtr this_01;
  
  if (objNode->nop != knopObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b0d,"(objNode->nop == knopObject)","objNode->nop == knopObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = ParseNode::AsParseNodeUni(objNode);
  this_00 = pPVar4->pnode1;
  while (this_00 != (ParseNode *)0x0) {
    this_01 = this_00;
    if (this_00->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      this_01 = pPVar5->pnode1;
    }
    if (this_01->nop != knopEllipsis) {
      pPVar5 = ParseNode::AsParseNodeBin(this_01);
      this = pPVar5->pnode1;
      pPVar5 = ParseNode::AsParseNodeBin(this_01);
      if ((this->nop != knopComputedName) && (pPVar5->pnode2->nop == knopInt)) {
        pPVar6 = ParseNode::AsParseNodeStr(this);
        Js::ScriptContext::TrackIntConstPropertyOnGlobalUserObject
                  (byteCodeGenerator->scriptContext,pPVar6->pid->m_propertyId);
      }
    }
    if (this_00->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      this_00 = pPVar5->pnode2;
    }
    else {
      this_00 = (ParseNode *)0x0;
    }
  }
  return;
}

Assistant:

void TrackMemberNodesInObjectForIntConstants(ByteCodeGenerator *byteCodeGenerator, ParseNodePtr objNode)
{
    Assert(objNode->nop == knopObject);

    ParseNodePtr memberList = objNode->AsParseNodeUni()->pnode1;

    while (memberList != nullptr)
    {
        ParseNodePtr memberNode = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode1 : memberList;
        if (memberNode->nop != knopEllipsis)
        {
            ParseNodePtr memberNameNode = memberNode->AsParseNodeBin()->pnode1;
            ParseNodePtr memberValNode = memberNode->AsParseNodeBin()->pnode2;

            if (memberNameNode->nop != knopComputedName && memberValNode->nop == knopInt)
            {
                Js::PropertyId propertyId = memberNameNode->AsParseNodeStr()->pid->GetPropertyId();
                TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, true, propertyId);
            }
        }

        memberList = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode2 : nullptr;
    }
}